

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_4_3_False(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  float *pfVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [32];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  float *data;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  uint uVar37;
  ulong uVar38;
  int iVar39;
  ulong uVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  int c2_1;
  int iVar44;
  long lVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  uint uVar51;
  float *pfVar52;
  float *pfVar53;
  float *pfVar54;
  long lVar55;
  long lVar56;
  int iVar57;
  ulong uVar58;
  int iVar59;
  int iVar60;
  int c2;
  int scale;
  long lVar61;
  int c2_4;
  long lVar62;
  int iVar63;
  int iVar64;
  float *pfVar65;
  ulong uVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  float fVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar103 [12];
  undefined1 auVar101 [16];
  undefined1 auVar102 [64];
  float fVar104;
  undefined1 in_ZMM8 [64];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar107;
  undefined1 auVar108 [64];
  int c1;
  int c1_1;
  int data_width;
  int local_148;
  
  auVar75._8_4_ = 0x3effffff;
  auVar75._0_8_ = 0x3effffff3effffff;
  auVar75._12_4_ = 0x3effffff;
  auVar74._8_4_ = 0x80000000;
  auVar74._0_8_ = 0x8000000080000000;
  auVar74._12_4_ = 0x80000000;
  auVar102 = ZEXT1664(auVar74);
  fVar82 = ipoint->scale;
  auVar108 = ZEXT464((uint)fVar82);
  auVar67 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)fVar82),auVar74,0xf8);
  auVar67 = ZEXT416((uint)(fVar82 + auVar67._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  fVar80 = -0.08 / (fVar82 * fVar82);
  scale = (int)auVar67._0_4_;
  auVar68._0_4_ = (int)auVar67._0_4_;
  auVar68._4_4_ = (int)auVar67._4_4_;
  auVar68._8_4_ = (int)auVar67._8_4_;
  auVar68._12_4_ = (int)auVar67._12_4_;
  auVar67 = vcvtdq2ps_avx(auVar68);
  auVar68 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)ipoint->x),auVar74,0xf8);
  auVar68 = ZEXT416((uint)(ipoint->x + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar69._0_8_ = (double)auVar68._0_4_;
  auVar69._8_8_ = auVar68._8_8_;
  auVar73._0_8_ = (double)fVar82;
  auVar73._8_8_ = 0;
  auVar68 = vfmadd231sd_fma(auVar69,auVar73,ZEXT816(0x3fe0000000000000));
  auVar72._0_4_ = (float)auVar68._0_8_;
  auVar72._4_12_ = auVar68._4_12_;
  auVar68 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)ipoint->y),auVar74,0xf8);
  fVar8 = auVar72._0_4_ - auVar67._0_4_;
  auVar68 = ZEXT416((uint)(ipoint->y + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar70._0_8_ = (double)auVar68._0_4_;
  auVar70._8_8_ = auVar68._8_8_;
  auVar68 = vfmadd231sd_fma(auVar70,auVar73,ZEXT816(0x3fe0000000000000));
  auVar69 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar82),auVar72);
  auVar71._0_4_ = (float)auVar68._0_8_;
  auVar71._4_12_ = auVar68._4_12_;
  fVar107 = auVar71._0_4_ - auVar67._0_4_;
  auVar67 = vpternlogd_avx512vl(auVar75,auVar69,auVar74,0xf8);
  auVar67 = ZEXT416((uint)(auVar69._0_4_ + auVar67._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  auVar68 = ZEXT416((uint)fVar82);
  if (scale < (int)auVar67._0_4_) {
    auVar76._8_4_ = 0x3effffff;
    auVar76._0_8_ = 0x3effffff3effffff;
    auVar76._12_4_ = 0x3effffff;
    auVar77._8_4_ = 0x80000000;
    auVar77._0_8_ = 0x8000000080000000;
    auVar77._12_4_ = 0x80000000;
    auVar67 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar68,auVar71);
    auVar69 = vpternlogd_avx512vl(auVar77,auVar67,auVar76,0xea);
    auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar69._0_4_));
    auVar67 = vroundss_avx(auVar67,auVar67,0xb);
    if (scale < (int)auVar67._0_4_) {
      auVar67 = vfmadd231ss_fma(auVar72,auVar68,ZEXT416(0x41300000));
      auVar78._8_4_ = 0x80000000;
      auVar78._0_8_ = 0x8000000080000000;
      auVar78._12_4_ = 0x80000000;
      auVar69 = vpternlogd_avx512vl(auVar78,auVar67,auVar76,0xea);
      auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar69._0_4_));
      auVar67 = vroundss_avx(auVar67,auVar67,0xb);
      if ((int)auVar67._0_4_ + scale <= iimage->width) {
        auVar67 = vfmadd231ss_fma(auVar71,auVar68,ZEXT416(0x41300000));
        auVar17._8_4_ = 0x80000000;
        auVar17._0_8_ = 0x8000000080000000;
        auVar17._12_4_ = 0x80000000;
        auVar69 = vpternlogd_avx512vl(auVar76,auVar67,auVar17,0xf8);
        auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar69._0_4_));
        auVar67 = vroundss_avx(auVar67,auVar67,0xb);
        if ((int)auVar67._0_4_ + scale <= iimage->height) {
          iVar1 = iimage->data_width;
          pfVar53 = iimage->data;
          iVar47 = scale * 2;
          fVar8 = fVar8 + 0.5;
          fVar107 = fVar107 + 0.5;
          pfVar65 = haarResponseY + 0x4a;
          pfVar52 = haarResponseX + 0x4a;
          uVar37 = 0xfffffff4;
          do {
            auVar67._0_4_ = (float)(int)uVar37;
            auVar103 = in_ZMM8._4_12_;
            auVar67._4_12_ = auVar103;
            auVar96._0_4_ = (float)(int)(uVar37 | 1);
            auVar96._4_12_ = auVar103;
            auVar100._0_4_ = (float)(int)(uVar37 | 2);
            auVar100._4_12_ = auVar103;
            auVar67 = vfmadd213ss_fma(auVar67,auVar68,ZEXT416((uint)fVar107));
            auVar69 = vfmadd213ss_fma(auVar96,auVar68,ZEXT416((uint)fVar107));
            auVar70 = vfmadd213ss_fma(auVar100,auVar68,ZEXT416((uint)fVar107));
            iVar24 = (int)auVar67._0_4_;
            iVar27 = (int)auVar69._0_4_;
            auVar97._0_4_ = (float)(int)(uVar37 | 3);
            auVar97._4_12_ = auVar103;
            iVar23 = (int)auVar70._0_4_;
            auVar67 = vfmadd213ss_fma(auVar97,auVar68,ZEXT416((uint)fVar107));
            iVar33 = (iVar24 + -1) * iVar1;
            iVar25 = (iVar24 + -1 + scale) * iVar1;
            iVar30 = (iVar24 + -1 + iVar47) * iVar1;
            iVar28 = (int)auVar67._0_4_;
            iVar34 = (iVar27 + -1) * iVar1;
            iVar26 = (iVar27 + -1 + scale) * iVar1;
            iVar31 = (iVar27 + -1 + iVar47) * iVar1;
            iVar24 = (iVar23 + -1) * iVar1;
            iVar27 = (iVar23 + -1 + scale) * iVar1;
            iVar32 = (iVar23 + -1 + iVar47) * iVar1;
            iVar29 = (iVar28 + -1) * iVar1;
            iVar23 = (iVar28 + -1 + scale) * iVar1;
            iVar28 = (iVar28 + -1 + iVar47) * iVar1;
            lVar42 = 0;
            do {
              iVar35 = (int)lVar42;
              auVar90._0_4_ = (float)(iVar35 + -0xc);
              auVar103 = auVar75._4_12_;
              auVar90._4_12_ = auVar103;
              auVar67 = vfmadd213ss_fma(auVar90,auVar68,ZEXT416((uint)fVar8));
              iVar39 = (int)auVar67._0_4_;
              auVar91._0_4_ = (float)(iVar35 + -0xb);
              auVar91._4_12_ = auVar103;
              auVar67 = vfmadd213ss_fma(auVar91,auVar68,ZEXT416((uint)fVar8));
              iVar50 = (int)auVar67._0_4_;
              auVar92._0_4_ = (float)(iVar35 + -10);
              auVar92._4_12_ = auVar103;
              auVar67 = vfmadd213ss_fma(auVar92,auVar68,ZEXT416((uint)fVar8));
              iVar36 = (int)auVar67._0_4_;
              iVar46 = iVar39 + -1 + scale;
              iVar49 = iVar39 + -1 + iVar47;
              iVar44 = iVar50 + -1 + iVar47;
              fVar82 = pfVar53[iVar30 + -1 + iVar39];
              fVar81 = pfVar53[iVar33 + iVar49];
              auVar70 = SUB6416(ZEXT464(0x40000000),0);
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar25 + -1 + iVar39] -
                                                      pfVar53[iVar25 + iVar49])),auVar70,
                                        ZEXT416((uint)(pfVar53[iVar30 + iVar49] -
                                                      pfVar53[iVar33 + -1 + iVar39])));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar33 + iVar46] -
                                                      pfVar53[iVar30 + iVar46])),auVar70,
                                        ZEXT416((uint)(pfVar53[iVar30 + iVar49] -
                                                      pfVar53[iVar33 + -1 + iVar39])));
              pfVar52[lVar42 + -0x4a] = (fVar82 - fVar81) + auVar69._0_4_;
              iVar48 = iVar50 + -1 + scale;
              pfVar65[lVar42 + -0x4a] = auVar67._0_4_ - (fVar82 - fVar81);
              fVar82 = pfVar53[iVar30 + -1 + iVar50];
              fVar81 = pfVar53[iVar33 + iVar44];
              iVar60 = iVar36 + -1 + iVar47;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar25 + -1 + iVar50] -
                                                      pfVar53[iVar25 + iVar44])),auVar70,
                                        ZEXT416((uint)(pfVar53[iVar30 + iVar44] -
                                                      pfVar53[iVar33 + -1 + iVar50])));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar33 + iVar48] -
                                                      pfVar53[iVar30 + iVar48])),auVar70,
                                        ZEXT416((uint)(pfVar53[iVar30 + iVar44] -
                                                      pfVar53[iVar33 + -1 + iVar50])));
              pfVar52[lVar42 + -0x49] = (fVar82 - fVar81) + auVar69._0_4_;
              pfVar65[lVar42 + -0x49] = auVar67._0_4_ - (fVar82 - fVar81);
              iVar57 = iVar36 + -1 + scale;
              fVar82 = pfVar53[iVar30 + -1 + iVar36];
              fVar81 = pfVar53[iVar33 + iVar60];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar25 + -1 + iVar36] -
                                                      pfVar53[iVar25 + iVar60])),auVar70,
                                        ZEXT416((uint)(pfVar53[iVar30 + iVar60] -
                                                      pfVar53[iVar33 + -1 + iVar36])));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar33 + iVar57] -
                                                      pfVar53[iVar30 + iVar57])),auVar70,
                                        ZEXT416((uint)(pfVar53[iVar30 + iVar60] -
                                                      pfVar53[iVar33 + -1 + iVar36])));
              pfVar52[lVar42 + -0x48] = (fVar82 - fVar81) + auVar69._0_4_;
              pfVar65[lVar42 + -0x48] = auVar67._0_4_ - (fVar82 - fVar81);
              fVar82 = pfVar53[iVar31 + -1 + iVar39];
              fVar81 = pfVar53[iVar34 + iVar49];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar26 + -1 + iVar39] -
                                                      pfVar53[iVar26 + iVar49])),auVar70,
                                        ZEXT416((uint)(pfVar53[iVar31 + iVar49] -
                                                      pfVar53[iVar34 + -1 + iVar39])));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar34 + iVar46] -
                                                      pfVar53[iVar31 + iVar46])),auVar70,
                                        ZEXT416((uint)(pfVar53[iVar31 + iVar49] -
                                                      pfVar53[iVar34 + -1 + iVar39])));
              pfVar52[lVar42 + -0x32] = (fVar82 - fVar81) + auVar69._0_4_;
              pfVar65[lVar42 + -0x32] = auVar67._0_4_ - (fVar82 - fVar81);
              fVar82 = pfVar53[iVar31 + -1 + iVar50];
              fVar81 = pfVar53[iVar34 + iVar44];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar26 + -1 + iVar50] -
                                                      pfVar53[iVar26 + iVar44])),auVar70,
                                        ZEXT416((uint)(pfVar53[iVar31 + iVar44] -
                                                      pfVar53[iVar34 + -1 + iVar50])));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar34 + iVar48] -
                                                      pfVar53[iVar31 + iVar48])),auVar70,
                                        ZEXT416((uint)(pfVar53[iVar31 + iVar44] -
                                                      pfVar53[iVar34 + -1 + iVar50])));
              pfVar52[lVar42 + -0x31] = (fVar82 - fVar81) + auVar69._0_4_;
              pfVar65[lVar42 + -0x31] = auVar67._0_4_ - (fVar82 - fVar81);
              fVar82 = pfVar53[iVar31 + -1 + iVar36];
              fVar81 = pfVar53[iVar34 + iVar60];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar26 + -1 + iVar36] -
                                                      pfVar53[iVar26 + iVar60])),auVar70,
                                        ZEXT416((uint)(pfVar53[iVar31 + iVar60] -
                                                      pfVar53[iVar34 + -1 + iVar36])));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar34 + iVar57] -
                                                      pfVar53[iVar31 + iVar57])),auVar70,
                                        ZEXT416((uint)(pfVar53[iVar31 + iVar60] -
                                                      pfVar53[iVar34 + -1 + iVar36])));
              pfVar52[lVar42 + -0x30] = (fVar82 - fVar81) + auVar69._0_4_;
              pfVar65[lVar42 + -0x30] = auVar67._0_4_ - (fVar82 - fVar81);
              fVar82 = pfVar53[iVar32 + -1 + iVar39];
              fVar81 = pfVar53[iVar24 + iVar49];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar27 + -1 + iVar39] -
                                                      pfVar53[iVar27 + iVar49])),auVar70,
                                        ZEXT416((uint)(pfVar53[iVar32 + iVar49] -
                                                      pfVar53[iVar24 + -1 + iVar39])));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar24 + iVar46] -
                                                      pfVar53[iVar32 + iVar46])),auVar70,
                                        ZEXT416((uint)(pfVar53[iVar32 + iVar49] -
                                                      pfVar53[iVar24 + -1 + iVar39])));
              pfVar52[lVar42 + -0x1a] = (fVar82 - fVar81) + auVar69._0_4_;
              pfVar65[lVar42 + -0x1a] = auVar67._0_4_ - (fVar82 - fVar81);
              fVar82 = pfVar53[iVar32 + -1 + iVar50];
              fVar81 = pfVar53[iVar24 + iVar44];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar27 + -1 + iVar50] -
                                                      pfVar53[iVar27 + iVar44])),auVar70,
                                        ZEXT416((uint)(pfVar53[iVar32 + iVar44] -
                                                      pfVar53[iVar24 + -1 + iVar50])));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar24 + iVar48] -
                                                      pfVar53[iVar32 + iVar48])),auVar70,
                                        ZEXT416((uint)(pfVar53[iVar32 + iVar44] -
                                                      pfVar53[iVar24 + -1 + iVar50])));
              pfVar52[lVar42 + -0x19] = (fVar82 - fVar81) + auVar69._0_4_;
              pfVar65[lVar42 + -0x19] = auVar67._0_4_ - (fVar82 - fVar81);
              fVar82 = pfVar53[iVar32 + -1 + iVar36];
              fVar81 = pfVar53[iVar24 + iVar60];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar27 + -1 + iVar36] -
                                                      pfVar53[iVar27 + iVar60])),auVar70,
                                        ZEXT416((uint)(pfVar53[iVar32 + iVar60] -
                                                      pfVar53[iVar24 + -1 + iVar36])));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar24 + iVar57] -
                                                      pfVar53[iVar32 + iVar57])),auVar70,
                                        ZEXT416((uint)(pfVar53[iVar32 + iVar60] -
                                                      pfVar53[iVar24 + -1 + iVar36])));
              pfVar52[lVar42 + -0x18] = (fVar82 - fVar81) + auVar69._0_4_;
              pfVar65[lVar42 + -0x18] = auVar67._0_4_ - (fVar82 - fVar81);
              fVar82 = pfVar53[iVar28 + -1 + iVar39];
              fVar81 = pfVar53[iVar29 + iVar49];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar23 + -1 + iVar39] -
                                                      pfVar53[iVar23 + iVar49])),auVar70,
                                        ZEXT416((uint)(pfVar53[iVar49 + iVar28] -
                                                      pfVar53[iVar29 + -1 + iVar39])));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar29 + iVar46] -
                                                      pfVar53[iVar46 + iVar28])),auVar70,
                                        ZEXT416((uint)(pfVar53[iVar49 + iVar28] -
                                                      pfVar53[iVar29 + -1 + iVar39])));
              pfVar52[lVar42 + -2] = (fVar82 - fVar81) + auVar69._0_4_;
              pfVar65[lVar42 + -2] = auVar67._0_4_ - (fVar82 - fVar81);
              fVar82 = pfVar53[iVar28 + -1 + iVar50];
              fVar81 = pfVar53[iVar29 + iVar44];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar29 + iVar48] -
                                                      pfVar53[iVar48 + iVar28])),auVar70,
                                        ZEXT416((uint)(pfVar53[iVar44 + iVar28] -
                                                      pfVar53[iVar29 + -1 + iVar50])));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar23 + -1 + iVar50] -
                                                      pfVar53[iVar23 + iVar44])),auVar70,
                                        ZEXT416((uint)(pfVar53[iVar44 + iVar28] -
                                                      pfVar53[iVar29 + -1 + iVar50])));
              pfVar52[lVar42 + -1] = (fVar82 - fVar81) + auVar67._0_4_;
              pfVar65[lVar42 + -1] = auVar69._0_4_ - (fVar82 - fVar81);
              fVar82 = pfVar53[iVar28 + -1 + iVar36];
              fVar81 = pfVar53[iVar29 + iVar60];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar29 + iVar57] -
                                                      pfVar53[iVar57 + iVar28])),auVar70,
                                        ZEXT416((uint)(pfVar53[iVar60 + iVar28] -
                                                      pfVar53[iVar29 + -1 + iVar36])));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar23 + -1 + iVar36] -
                                                      pfVar53[iVar23 + iVar60])),auVar70,
                                        ZEXT416((uint)(pfVar53[iVar60 + iVar28] -
                                                      pfVar53[iVar29 + -1 + iVar36])));
              pfVar52[lVar42] = (fVar82 - fVar81) + auVar67._0_4_;
              pfVar65[lVar42] = auVar69._0_4_ - (fVar82 - fVar81);
              lVar42 = lVar42 + 3;
            } while (iVar35 + -0xc < 9);
            pfVar65 = pfVar65 + 0x60;
            pfVar52 = pfVar52 + 0x60;
            bVar3 = (int)uVar37 < 8;
            uVar37 = uVar37 + 4;
          } while (bVar3);
          goto LAB_0021885c;
        }
      }
    }
  }
  iVar1 = scale * 2;
  lVar42 = 0;
  uVar37 = 0xfffffff4;
  do {
    auVar67 = vpbroadcastd_avx512vl();
    auVar18._8_4_ = 3;
    auVar18._0_8_ = 0x200000003;
    auVar18._12_4_ = 2;
    auVar67 = vporq_avx512vl(auVar67,auVar18);
    auVar21._4_4_ = fVar107;
    auVar21._0_4_ = fVar107;
    auVar21._8_4_ = fVar107;
    auVar21._12_4_ = fVar107;
    auVar67 = vpinsrd_avx(auVar67,uVar37 | 1,2);
    auVar67 = vpinsrd_avx(auVar67,uVar37,3);
    auVar67 = vcvtdq2ps_avx(auVar67);
    auVar22._4_4_ = fVar82;
    auVar22._0_4_ = fVar82;
    auVar22._8_4_ = fVar82;
    auVar22._12_4_ = fVar82;
    auVar67 = vfmadd132ps_fma(auVar67,auVar21,auVar22);
    uVar38 = vcmpps_avx512vl(auVar67,_DAT_00599190,0xd);
    auVar7 = vcvtps2pd_avx(auVar67);
    auVar85._8_8_ = 0xbfe0000000000000;
    auVar85._0_8_ = 0xbfe0000000000000;
    auVar85._16_8_ = 0xbfe0000000000000;
    auVar85._24_8_ = 0xbfe0000000000000;
    auVar79._12_4_ = 0x3fe00000;
    auVar79._0_12_ = ZEXT812(0x3fe0000000000000);
    auVar79._16_8_ = 0x3fe0000000000000;
    auVar79._24_8_ = 0x3fe0000000000000;
    auVar79 = vblendmpd_avx512vl(auVar85,auVar79);
    bVar3 = (bool)((byte)uVar38 & 1);
    bVar4 = (bool)((byte)(uVar38 >> 1) & 1);
    bVar5 = (bool)((byte)(uVar38 >> 2) & 1);
    bVar6 = (bool)((byte)(uVar38 >> 3) & 1);
    auVar83._0_4_ =
         (int)((double)((ulong)bVar3 * auVar79._0_8_ | (ulong)!bVar3 * -0x4020000000000000) +
              auVar7._0_8_);
    auVar83._4_4_ =
         (int)((double)((ulong)bVar4 * auVar79._8_8_ | (ulong)!bVar4 * -0x4020000000000000) +
              auVar7._8_8_);
    auVar83._8_4_ =
         (int)((double)((ulong)bVar5 * auVar79._16_8_ | (ulong)!bVar5 * -0x4020000000000000) +
              auVar7._16_8_);
    auVar83._12_4_ =
         (int)((double)((ulong)bVar6 * auVar79._24_8_ | (ulong)!bVar6 * -0x4020000000000000) +
              auVar7._24_8_);
    auVar19._8_4_ = 1;
    auVar19._0_8_ = 0x100000001;
    auVar19._12_4_ = 1;
    uVar38 = vpcmpd_avx512vl(auVar83,auVar19,1);
    uVar66 = uVar38 & 0xf;
    iVar27 = iVar1 + auVar83._12_4_;
    iVar28 = auVar83._12_4_ + -1 + scale;
    iVar29 = iVar1 + -1 + auVar83._12_4_;
    iVar23 = auVar83._12_4_ + -1;
    uVar58 = uVar66 >> 1;
    iVar30 = iVar1 + auVar83._8_4_;
    iVar31 = auVar83._8_4_ + -1 + scale;
    iVar32 = auVar83._8_4_ + -1;
    iVar24 = iVar1 + -1 + auVar83._8_4_;
    iVar33 = iVar1 + auVar83._4_4_;
    iVar34 = auVar83._4_4_ + -1;
    uVar40 = uVar66 >> 2;
    uVar66 = uVar66 >> 3;
    iVar35 = auVar83._4_4_ + -1 + scale;
    iVar25 = iVar1 + -1 + auVar83._4_4_;
    iVar46 = auVar83._0_4_ + -1 + scale;
    iVar36 = iVar1 + auVar83._0_4_;
    iVar39 = iVar1 + -1 + auVar83._0_4_;
    iVar26 = auVar83._0_4_ + -1;
    pfVar53 = haarResponseX;
    pfVar65 = haarResponseY;
    lVar41 = lVar42;
    iVar47 = -0xc;
    do {
      auVar84._0_4_ = (float)iVar47;
      auVar103 = auVar102._4_12_;
      auVar84._4_12_ = auVar103;
      auVar69 = auVar108._0_16_;
      auVar67 = vfmadd213ss_fma(auVar84,auVar69,ZEXT416((uint)fVar8));
      auVar99._0_4_ = (float)(iVar47 + 1);
      auVar99._4_12_ = auVar103;
      auVar94._0_4_ = (float)(iVar47 + 2);
      auVar94._4_12_ = auVar103;
      fVar81 = auVar67._0_4_;
      auVar101._0_8_ = (double)fVar81;
      auVar101._8_8_ = auVar67._8_8_;
      auVar102 = ZEXT1664(auVar101);
      auVar67 = vfmadd213ss_fma(auVar99,auVar69,ZEXT416((uint)fVar8));
      auVar69 = vfmadd213ss_fma(auVar94,auVar69,ZEXT416((uint)fVar8));
      fVar98 = auVar67._0_4_;
      fVar93 = auVar69._0_4_;
      iVar57 = (int)((double)((ulong)(0.0 <= fVar81) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar81) * -0x4020000000000000) + auVar101._0_8_);
      if ((iVar57 < 1 || uVar66 != 0) || (iimage->height < iVar27)) {
LAB_002178fa:
        auVar102 = ZEXT1664(auVar101);
        haarXY(iimage,auVar83._12_4_,iVar57,scale,(float *)((long)pfVar53 + lVar41),
               (float *)((long)pfVar65 + lVar41));
        iVar44 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar44 = iimage->width;
        iVar48 = iVar1 + iVar57;
        if (iVar44 < iVar48) goto LAB_002178fa;
        iVar59 = iVar57 + -1 + scale;
        iVar49 = iimage->data_width;
        pfVar52 = iimage->data;
        iVar50 = iVar49 * iVar23;
        iVar60 = iVar49 * iVar29;
        fVar81 = pfVar52[iVar60 + -1 + iVar57];
        fVar9 = pfVar52[iVar50 + -1 + iVar48];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar50 + iVar59] - pfVar52[iVar60 + iVar59]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar52[iVar60 + -1 + iVar48] -
                                                pfVar52[iVar50 + -1 + iVar57])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar49 * iVar28 + -1 + iVar57] -
                                                pfVar52[iVar49 * iVar28 + -1 + iVar48])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar52[iVar60 + -1 + iVar48] -
                                                pfVar52[iVar50 + -1 + iVar57])));
        *(float *)((long)pfVar53 + lVar41) = (fVar81 - fVar9) + auVar67._0_4_;
        *(float *)((long)pfVar65 + lVar41) = auVar69._0_4_ - (fVar81 - fVar9);
      }
      pfVar52 = (float *)((long)pfVar53 + lVar41 + 4);
      pfVar54 = (float *)((long)pfVar65 + lVar41 + 4);
      iVar48 = (int)((double)((ulong)(0.0 <= fVar98) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar98) * -0x4020000000000000) + (double)fVar98);
      if (((iVar48 < 1 || uVar66 != 0) || (iimage->height < iVar27)) ||
         (iVar49 = iVar1 + iVar48, iVar44 < iVar49)) {
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._12_4_,iVar48,scale,pfVar52,pfVar54);
        iVar44 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar50 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar59 = iVar48 + -1 + scale;
        iVar60 = iVar50 * iVar23;
        iVar64 = iVar50 * iVar29;
        fVar81 = pfVar2[iVar64 + -1 + iVar48];
        fVar98 = pfVar2[iVar60 + -1 + iVar49];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 + iVar59] - pfVar2[iVar64 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar64 + -1 + iVar49] -
                                                pfVar2[iVar60 + -1 + iVar48])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar50 * iVar28 + -1 + iVar48] -
                                                pfVar2[iVar50 * iVar28 + -1 + iVar49])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar64 + -1 + iVar49] -
                                                pfVar2[iVar60 + -1 + iVar48])));
        *pfVar52 = (fVar81 - fVar98) + auVar67._0_4_;
        *pfVar54 = auVar69._0_4_ - (fVar81 - fVar98);
      }
      pfVar52 = (float *)((long)pfVar53 + lVar41 + 8);
      pfVar54 = (float *)((long)pfVar65 + lVar41 + 8);
      iVar49 = (int)((double)((ulong)(0.0 <= fVar93) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar93) * -0x4020000000000000) + (double)fVar93);
      if (((iVar49 < 1 || uVar66 != 0) || (iimage->height < iVar27)) ||
         (iVar50 = iVar1 + iVar49, iVar44 < iVar50)) {
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._12_4_,iVar49,scale,pfVar52,pfVar54);
        iVar44 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar60 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar64 = iVar49 + -1 + scale;
        iVar59 = iVar60 * iVar23;
        iVar63 = iVar60 * iVar29;
        fVar81 = pfVar2[iVar63 + -1 + iVar49];
        fVar93 = pfVar2[iVar59 + -1 + iVar50];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar59 + iVar64] - pfVar2[iVar63 + iVar64]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar50] -
                                                pfVar2[iVar59 + -1 + iVar49])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 * iVar28 + -1 + iVar49] -
                                                pfVar2[iVar60 * iVar28 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar50] -
                                                pfVar2[iVar59 + -1 + iVar49])));
        *pfVar52 = (fVar81 - fVar93) + auVar67._0_4_;
        *pfVar54 = auVar69._0_4_ - (fVar81 - fVar93);
      }
      pfVar52 = (float *)((long)pfVar53 + lVar41 + 0x60);
      pfVar54 = (float *)((long)pfVar65 + lVar41 + 0x60);
      if (((iVar57 < 1 || (uVar40 & 1) != 0) || (iimage->height < iVar30)) ||
         (iVar50 = iVar1 + iVar57, iVar44 < iVar50)) {
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._8_4_,iVar57,scale,pfVar52,pfVar54);
        iVar44 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar60 = iimage->data_width;
        iVar59 = iVar57 + -1 + scale;
        pfVar2 = iimage->data;
        iVar64 = iVar60 * iVar32;
        iVar63 = iVar60 * iVar24;
        fVar81 = pfVar2[iVar63 + -1 + iVar57];
        fVar93 = pfVar2[iVar64 + -1 + iVar50];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar64 + iVar59] - pfVar2[iVar63 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar50] -
                                                pfVar2[iVar64 + -1 + iVar57])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 * iVar31 + -1 + iVar57] -
                                                pfVar2[iVar60 * iVar31 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar50] -
                                                pfVar2[iVar64 + -1 + iVar57])));
        *pfVar52 = (fVar81 - fVar93) + auVar67._0_4_;
        *pfVar54 = auVar69._0_4_ - (fVar81 - fVar93);
      }
      pfVar52 = (float *)((long)pfVar53 + lVar41 + 100);
      pfVar54 = (float *)((long)pfVar65 + lVar41 + 100);
      if (((iVar48 < 1 || (uVar40 & 1) != 0) || (iimage->height < iVar30)) ||
         (iVar50 = iVar1 + iVar48, iVar44 < iVar50)) {
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._8_4_,iVar48,scale,pfVar52,pfVar54);
        iVar44 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar60 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar64 = iVar48 + -1 + scale;
        iVar59 = iVar60 * iVar32;
        iVar63 = iVar60 * iVar24;
        fVar81 = pfVar2[iVar63 + -1 + iVar48];
        fVar93 = pfVar2[iVar59 + -1 + iVar50];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar59 + iVar64] - pfVar2[iVar63 + iVar64]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar50] -
                                                pfVar2[iVar59 + -1 + iVar48])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 * iVar31 + -1 + iVar48] -
                                                pfVar2[iVar60 * iVar31 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar50] -
                                                pfVar2[iVar59 + -1 + iVar48])));
        *pfVar52 = (fVar81 - fVar93) + auVar67._0_4_;
        *pfVar54 = auVar69._0_4_ - (fVar81 - fVar93);
      }
      pfVar52 = (float *)((long)pfVar53 + lVar41 + 0x68);
      pfVar54 = (float *)((long)pfVar65 + lVar41 + 0x68);
      if (((iVar49 < 1 || (uVar40 & 1) != 0) || (iimage->height < iVar30)) ||
         (iVar50 = iVar1 + iVar49, iVar44 < iVar50)) {
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._8_4_,iVar49,scale,pfVar52,pfVar54);
        iVar44 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar60 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar64 = iVar49 + -1 + scale;
        iVar59 = iVar60 * iVar32;
        iVar63 = iVar60 * iVar24;
        fVar81 = pfVar2[iVar63 + -1 + iVar49];
        fVar93 = pfVar2[iVar59 + -1 + iVar50];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar59 + iVar64] - pfVar2[iVar63 + iVar64]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar50] -
                                                pfVar2[iVar59 + -1 + iVar49])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 * iVar31 + -1 + iVar49] -
                                                pfVar2[iVar60 * iVar31 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar50] -
                                                pfVar2[iVar59 + -1 + iVar49])));
        *pfVar52 = (fVar81 - fVar93) + auVar67._0_4_;
        *pfVar54 = auVar69._0_4_ - (fVar81 - fVar93);
      }
      pfVar52 = (float *)((long)pfVar53 + lVar41 + 0xc0);
      pfVar54 = (float *)(lVar41 + 0xc0 + (long)pfVar65);
      if (((iVar57 < 1 || (uVar58 & 1) != 0) || (iimage->height < iVar33)) ||
         (iVar50 = iVar1 + iVar57, iVar44 < iVar50)) {
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._4_4_,iVar57,scale,pfVar52,pfVar54);
        iVar44 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar60 = iimage->data_width;
        iVar59 = iVar57 + -1 + scale;
        pfVar2 = iimage->data;
        iVar64 = iVar60 * iVar34;
        iVar63 = iVar60 * iVar25;
        fVar81 = pfVar2[iVar63 + -1 + iVar57];
        fVar93 = pfVar2[iVar64 + -1 + iVar50];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar64 + iVar59] - pfVar2[iVar63 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar50] -
                                                pfVar2[iVar64 + -1 + iVar57])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 * iVar35 + -1 + iVar57] -
                                                pfVar2[iVar60 * iVar35 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar50] -
                                                pfVar2[iVar64 + -1 + iVar57])));
        *pfVar52 = (fVar81 - fVar93) + auVar67._0_4_;
        *pfVar54 = auVar69._0_4_ - (fVar81 - fVar93);
      }
      pfVar52 = (float *)((long)pfVar53 + lVar41 + 0xc4);
      pfVar54 = (float *)(lVar41 + 0xc4 + (long)pfVar65);
      if (((iVar48 < 1 || (uVar58 & 1) != 0) || (iimage->height < iVar33)) ||
         (iVar50 = iVar1 + iVar48, iVar44 < iVar50)) {
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._4_4_,iVar48,scale,pfVar52,pfVar54);
        iVar44 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar60 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar64 = iVar48 + -1 + scale;
        iVar59 = iVar60 * iVar34;
        iVar63 = iVar60 * iVar25;
        fVar81 = pfVar2[iVar63 + -1 + iVar48];
        fVar93 = pfVar2[iVar59 + -1 + iVar50];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar59 + iVar64] - pfVar2[iVar63 + iVar64]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar50] -
                                                pfVar2[iVar59 + -1 + iVar48])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 * iVar35 + -1 + iVar48] -
                                                pfVar2[iVar60 * iVar35 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar50] -
                                                pfVar2[iVar59 + -1 + iVar48])));
        *pfVar52 = (fVar81 - fVar93) + auVar67._0_4_;
        *pfVar54 = auVar69._0_4_ - (fVar81 - fVar93);
      }
      pfVar52 = (float *)((long)pfVar53 + lVar41 + 200);
      pfVar54 = (float *)(lVar41 + 200 + (long)pfVar65);
      if (((iVar49 < 1 || (uVar58 & 1) != 0) || (iimage->height < iVar33)) ||
         (iVar50 = iVar1 + iVar49, iVar44 < iVar50)) {
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._4_4_,iVar49,scale,pfVar52,pfVar54);
        iVar44 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar60 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar64 = iVar49 + -1 + scale;
        iVar59 = iVar60 * iVar34;
        iVar63 = iVar60 * iVar25;
        fVar81 = pfVar2[iVar63 + -1 + iVar49];
        fVar93 = pfVar2[iVar59 + -1 + iVar50];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar59 + iVar64] - pfVar2[iVar63 + iVar64]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar50] -
                                                pfVar2[iVar59 + -1 + iVar49])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 * iVar35 + -1 + iVar49] -
                                                pfVar2[iVar60 * iVar35 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar63 + -1 + iVar50] -
                                                pfVar2[iVar59 + -1 + iVar49])));
        *pfVar52 = (fVar81 - fVar93) + auVar67._0_4_;
        *pfVar54 = auVar69._0_4_ - (fVar81 - fVar93);
      }
      pfVar52 = (float *)((long)pfVar53 + lVar41 + 0x120);
      pfVar54 = (float *)(lVar41 + 0x120 + (long)pfVar65);
      if (((iVar57 < 1 || (uVar38 & 1) != 0) || (iimage->height < iVar36)) ||
         (iVar50 = iVar1 + iVar57, iVar44 < iVar50)) {
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._0_4_,iVar57,scale,pfVar52,pfVar54);
        iVar44 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar60 = iimage->data_width;
        iVar59 = iVar57 + -1 + scale;
        pfVar2 = iimage->data;
        iVar63 = iVar60 * iVar26;
        iVar64 = iVar60 * iVar39;
        fVar81 = pfVar2[iVar64 + -1 + iVar57];
        fVar93 = pfVar2[iVar63 + -1 + iVar50];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar63 + iVar59] - pfVar2[iVar64 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar64 + -1 + iVar50] -
                                                pfVar2[iVar63 + -1 + iVar57])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 * iVar46 + -1 + iVar57] -
                                                pfVar2[iVar60 * iVar46 + -1 + iVar50])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar64 + -1 + iVar50] -
                                                pfVar2[iVar63 + -1 + iVar57])));
        *pfVar52 = (fVar81 - fVar93) + auVar67._0_4_;
        *pfVar54 = auVar69._0_4_ - (fVar81 - fVar93);
      }
      pfVar52 = (float *)((long)pfVar53 + lVar41 + 0x124);
      pfVar54 = (float *)(lVar41 + 0x124 + (long)pfVar65);
      if (((iVar48 < 1 || (uVar38 & 1) != 0) || (iimage->height < iVar36)) ||
         (iVar57 = iVar1 + iVar48, iVar44 < iVar57)) {
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._0_4_,iVar48,scale,pfVar52,pfVar54);
        iVar44 = iimage->width;
        pfVar53 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar50 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar60 = iVar48 + -1 + scale;
        iVar64 = iVar50 * iVar26;
        iVar59 = iVar50 * iVar39;
        fVar81 = pfVar2[iVar59 + -1 + iVar48];
        fVar93 = pfVar2[iVar64 + -1 + iVar57];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar64 + iVar60] - pfVar2[iVar59 + iVar60]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar59 + -1 + iVar57] -
                                                pfVar2[iVar64 + -1 + iVar48])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar50 * iVar46 + -1 + iVar48] -
                                                pfVar2[iVar50 * iVar46 + -1 + iVar57])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar59 + -1 + iVar57] -
                                                pfVar2[iVar64 + -1 + iVar48])));
        *pfVar52 = (fVar81 - fVar93) + auVar67._0_4_;
        *pfVar54 = auVar69._0_4_ - (fVar81 - fVar93);
      }
      pfVar52 = (float *)((long)pfVar53 + lVar41 + 0x128);
      pfVar54 = (float *)(lVar41 + 0x128 + (long)pfVar65);
      if (((iVar49 < 1 || (uVar38 & 1) != 0) || (iimage->height < iVar36)) ||
         (iVar57 = iVar1 + iVar49, iVar44 < iVar57)) {
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._0_4_,iVar49,scale,pfVar52,pfVar54);
        pfVar53 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar44 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar48 = iVar49 + -1 + scale;
        iVar60 = iVar44 * iVar26;
        iVar50 = iVar44 * iVar39;
        fVar81 = pfVar2[iVar50 + -1 + iVar49];
        fVar93 = pfVar2[iVar60 + -1 + iVar57];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar60 + iVar48] - pfVar2[iVar50 + iVar48]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar50 + -1 + iVar57] -
                                                pfVar2[iVar60 + -1 + iVar49])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar44 * iVar46 + -1 + iVar49] -
                                                pfVar2[iVar44 * iVar46 + -1 + iVar57])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar50 + -1 + iVar57] -
                                                pfVar2[iVar60 + -1 + iVar49])));
        *pfVar52 = (fVar81 - fVar93) + auVar67._0_4_;
        *pfVar54 = auVar69._0_4_ - (fVar81 - fVar93);
      }
      auVar108 = ZEXT1664(auVar68);
      lVar41 = lVar41 + 0xc;
      bVar3 = iVar47 < 9;
      iVar47 = iVar47 + 3;
    } while (bVar3);
    lVar42 = lVar42 + 0x180;
    bVar3 = (int)uVar37 < 8;
    uVar37 = uVar37 + 4;
  } while (bVar3);
LAB_0021885c:
  fVar107 = auVar108._0_4_;
  auVar106._8_4_ = 0x3effffff;
  auVar106._0_8_ = 0x3effffff3effffff;
  auVar106._12_4_ = 0x3effffff;
  auVar105._8_4_ = 0x80000000;
  auVar105._0_8_ = 0x8000000080000000;
  auVar105._12_4_ = 0x80000000;
  auVar67 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 0.5)),auVar105,0xf8);
  auVar67 = ZEXT416((uint)(fVar107 * 0.5 + auVar67._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  auVar68 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 1.5)),auVar105,0xf8);
  auVar68 = ZEXT416((uint)(fVar107 * 1.5 + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar69 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 2.5)),auVar105,0xf8);
  auVar69 = ZEXT416((uint)(fVar107 * 2.5 + auVar69._0_4_));
  auVar69 = vroundss_avx(auVar69,auVar69,0xb);
  auVar70 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 3.5)),auVar105,0xf8);
  auVar70 = ZEXT416((uint)(fVar107 * 3.5 + auVar70._0_4_));
  auVar70 = vroundss_avx(auVar70,auVar70,0xb);
  auVar71 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 4.5)),auVar105,0xf8);
  auVar71 = ZEXT416((uint)(fVar107 * 4.5 + auVar71._0_4_));
  auVar71 = vroundss_avx(auVar71,auVar71,0xb);
  auVar72 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 5.5)),auVar105,0xf8);
  auVar72 = ZEXT416((uint)(fVar107 * 5.5 + auVar72._0_4_));
  auVar72 = vroundss_avx(auVar72,auVar72,0xb);
  auVar73 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 6.5)),auVar105,0xf8);
  auVar73 = ZEXT416((uint)(fVar107 * 6.5 + auVar73._0_4_));
  auVar73 = vroundss_avx(auVar73,auVar73,0xb);
  auVar74 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 7.5)),auVar105,0xf8);
  auVar74 = ZEXT416((uint)(auVar74._0_4_ + fVar107 * 7.5));
  auVar74 = vroundss_avx(auVar74,auVar74,0xb);
  auVar75 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 8.5)),auVar105,0xf8);
  auVar75 = ZEXT416((uint)(fVar107 * 8.5 + auVar75._0_4_));
  auVar75 = vroundss_avx(auVar75,auVar75,0xb);
  auVar76 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 9.5)),auVar105,0xf8);
  auVar76 = ZEXT416((uint)(fVar107 * 9.5 + auVar76._0_4_));
  auVar76 = vroundss_avx(auVar76,auVar76,0xb);
  auVar77 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 10.5)),auVar105,0xf8);
  auVar77 = ZEXT416((uint)(fVar107 * 10.5 + auVar77._0_4_));
  auVar77 = vroundss_avx(auVar77,auVar77,0xb);
  auVar78 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 11.5)),auVar105,0xf8);
  fVar87 = auVar69._0_4_;
  fVar82 = fVar87 + auVar68._0_4_;
  fVar8 = fVar87 + auVar67._0_4_;
  auVar69 = ZEXT416((uint)(fVar107 * 11.5 + auVar78._0_4_));
  auVar69 = vroundss_avx(auVar69,auVar69,0xb);
  fVar107 = fVar87 - auVar67._0_4_;
  fVar81 = fVar87 - auVar68._0_4_;
  fVar93 = fVar87 - auVar70._0_4_;
  fVar98 = fVar87 - auVar71._0_4_;
  fVar9 = fVar87 - auVar72._0_4_;
  fVar87 = fVar87 - auVar73._0_4_;
  fVar104 = auVar74._0_4_;
  fVar10 = fVar104 - auVar70._0_4_;
  fVar11 = fVar104 - auVar71._0_4_;
  fVar12 = fVar104 - auVar72._0_4_;
  fVar13 = fVar104 - auVar73._0_4_;
  fVar14 = fVar104 - auVar75._0_4_;
  fVar15 = fVar104 - auVar76._0_4_;
  fVar16 = fVar104 - auVar77._0_4_;
  fVar104 = fVar104 - auVar69._0_4_;
  gauss_s1_c0[0] = expf(fVar82 * fVar82 * fVar80);
  gauss_s1_c0[1] = expf(fVar8 * fVar8 * fVar80);
  gauss_s1_c0[2] = expf(fVar107 * fVar107 * fVar80);
  gauss_s1_c0[3] = expf(fVar81 * fVar81 * fVar80);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar93 * fVar93 * fVar80);
  gauss_s1_c0[6] = expf(fVar98 * fVar98 * fVar80);
  gauss_s1_c0[7] = expf(fVar9 * fVar9 * fVar80);
  gauss_s1_c0[8] = expf(fVar87 * fVar87 * fVar80);
  gauss_s1_c1[0] = expf(fVar10 * fVar10 * fVar80);
  gauss_s1_c1[1] = expf(fVar11 * fVar11 * fVar80);
  gauss_s1_c1[2] = expf(fVar12 * fVar12 * fVar80);
  gauss_s1_c1[3] = expf(fVar13 * fVar13 * fVar80);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar14 * fVar14 * fVar80);
  gauss_s1_c1[6] = expf(fVar15 * fVar15 * fVar80);
  gauss_s1_c1[7] = expf(fVar16 * fVar16 * fVar80);
  gauss_s1_c1[8] = expf(fVar104 * fVar104 * fVar80);
  auVar86._8_4_ = 0x7fffffff;
  auVar86._0_8_ = 0x7fffffff7fffffff;
  auVar86._12_4_ = 0x7fffffff;
  uVar38 = 0xfffffff8;
  fVar82 = 0.0;
  lVar42 = 0;
  lVar41 = 0;
  local_148 = 0;
  do {
    pfVar53 = gauss_s1_c1;
    uVar37 = (uint)uVar38;
    if (uVar37 != 7) {
      pfVar53 = gauss_s1_c0;
    }
    lVar61 = (long)local_148;
    lVar41 = (long)(int)lVar41;
    if (uVar37 == 0xfffffff8) {
      pfVar53 = gauss_s1_c1;
    }
    uVar58 = 0;
    local_148 = local_148 + 4;
    uVar51 = 0xfffffff8;
    lVar55 = (long)haarResponseX + lVar42;
    lVar43 = (long)haarResponseY + lVar42;
    do {
      pfVar65 = gauss_s1_c1;
      if (uVar51 != 7) {
        pfVar65 = gauss_s1_c0;
      }
      auVar102 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar51 == 0xfffffff8) {
        pfVar65 = gauss_s1_c1;
      }
      uVar66 = (ulong)(uVar51 >> 0x1c & 0xfffffff8);
      uVar40 = uVar58;
      lVar45 = lVar43;
      lVar62 = lVar55;
      do {
        lVar56 = 0;
        pfVar52 = (float *)((long)pfVar53 + (ulong)(uint)((int)(uVar38 >> 0x1f) << 5));
        do {
          fVar8 = pfVar65[uVar66] * *pfVar52;
          pfVar52 = pfVar52 + (ulong)(~uVar37 >> 0x1f) * 2 + -1;
          auVar67 = vinsertps_avx(ZEXT416(*(uint *)(lVar45 + lVar56 * 4)),
                                  ZEXT416(*(uint *)(lVar62 + lVar56 * 4)),0x10);
          lVar56 = lVar56 + 1;
          auVar95._0_4_ = fVar8 * auVar67._0_4_;
          auVar95._4_4_ = fVar8 * auVar67._4_4_;
          auVar95._8_4_ = fVar8 * auVar67._8_4_;
          auVar95._12_4_ = fVar8 * auVar67._12_4_;
          auVar67 = vandps_avx(auVar95,auVar86);
          auVar67 = vmovlhps_avx(auVar95,auVar67);
          auVar88._0_4_ = auVar102._0_4_ + auVar67._0_4_;
          auVar88._4_4_ = auVar102._4_4_ + auVar67._4_4_;
          auVar88._8_4_ = auVar102._8_4_ + auVar67._8_4_;
          auVar88._12_4_ = auVar102._12_4_ + auVar67._12_4_;
          auVar102 = ZEXT1664(auVar88);
        } while (lVar56 != 9);
        uVar40 = uVar40 + 0x18;
        uVar66 = uVar66 + (ulong)(-1 < (int)uVar51) * 2 + -1;
        lVar62 = lVar62 + 0x60;
        lVar45 = lVar45 + 0x60;
      } while (uVar40 < uVar51 * 0x18 + 0x198);
      uVar51 = uVar51 + 5;
      uVar58 = uVar58 + 0x78;
      fVar8 = gauss_s2_arr[lVar61];
      auVar20._4_4_ = fVar8;
      auVar20._0_4_ = fVar8;
      auVar20._8_4_ = fVar8;
      auVar20._12_4_ = fVar8;
      auVar70 = vmulps_avx512vl(auVar88,auVar20);
      lVar61 = lVar61 + 1;
      auVar89._0_4_ = auVar70._0_4_ * auVar70._0_4_;
      auVar89._4_4_ = auVar70._4_4_ * auVar70._4_4_;
      auVar89._8_4_ = auVar70._8_4_ * auVar70._8_4_;
      auVar89._12_4_ = auVar70._12_4_ * auVar70._12_4_;
      auVar68 = vshufpd_avx(auVar70,auVar70,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar41) = auVar70;
      lVar41 = lVar41 + 4;
      lVar55 = lVar55 + 0x1e0;
      lVar43 = lVar43 + 0x1e0;
      auVar67 = vmovshdup_avx(auVar89);
      auVar69 = vfmadd231ss_fma(auVar67,auVar70,auVar70);
      auVar67 = vshufps_avx(auVar70,auVar70,0xff);
      auVar68 = vfmadd213ss_fma(auVar68,auVar68,auVar69);
      auVar67 = vfmadd213ss_fma(auVar67,auVar67,auVar68);
      fVar82 = fVar82 + auVar67._0_4_;
    } while (local_148 != (int)lVar61);
    lVar42 = lVar42 + 0x14;
    uVar38 = (ulong)(uVar37 + 5);
  } while ((int)uVar37 < 3);
  if (fVar82 < 0.0) {
    fVar82 = sqrtf(fVar82);
  }
  else {
    auVar67 = vsqrtss_avx(ZEXT416((uint)fVar82),ZEXT416((uint)fVar82));
    fVar82 = auVar67._0_4_;
  }
  lVar42 = 0;
  auVar102 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar82)));
  do {
    auVar108 = vmulps_avx512f(auVar102,*(undefined1 (*) [64])(ipoint->descriptor + lVar42));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar42) = auVar108;
    lVar42 = lVar42 + 0x10;
  } while (lVar42 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_4_3_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            float ipoint_y_sub_int_scale_add_l2_mul_scale = ipoint_y_sub_int_scale + l2 * scale;
            float ipoint_y_sub_int_scale_add_l3_mul_scale = ipoint_y_sub_int_scale + l3 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_l2_mul_scale + (ipoint_y_sub_int_scale_add_l2_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_l3_mul_scale + (ipoint_y_sub_int_scale_add_l3_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_05 + l2 * scale);
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_05 + l3 * scale);

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}